

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

void Io_NtkWriteNodeInt(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  void *pvVar5;
  Abc_Ntk_t *pAVar6;
  char *pcVar7;
  word wVar8;
  ulong local_158;
  word local_140;
  uint local_e8 [2];
  int pVars [2] [10];
  int nVarsMin [2];
  int iVar;
  int c;
  word Cofs7 [2] [2];
  word Cofs6 [2];
  word uTruth7 [2];
  word uTruth6;
  word z;
  char *pSop;
  int nVars;
  int i;
  Abc_Obj_t *pNet;
  Vec_Int_t *vCover_local;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 < 8) {
    fprintf((FILE *)pFile,"\n");
    if (iVar1 < 5) {
      fprintf((FILE *)pFile,".names");
      for (pSop._4_4_ = 0; iVar1 = Abc_ObjFaninNum(pNode), (int)pSop._4_4_ < iVar1;
          pSop._4_4_ = pSop._4_4_ + 1) {
        pAVar3 = Abc_ObjFanin(pNode,pSop._4_4_);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s",pcVar4);
      }
      pAVar3 = Abc_ObjFanout0(pNode);
      pcVar4 = Abc_ObjName(pAVar3);
      fprintf((FILE *)pFile," %s\n",pcVar4);
      pvVar5 = Abc_ObjData(pNode);
      fprintf((FILE *)pFile,"%s",pvVar5);
    }
    else {
      uTruth7[1] = 0;
      for (pSop._4_4_ = 0; iVar2 = Abc_ObjFaninNum(pNode), (int)pSop._4_4_ < iVar2;
          pSop._4_4_ = pSop._4_4_ + 1) {
        Abc_ObjFanin(pNode,pSop._4_4_);
        nVarsMin[(long)(int)pSop._4_4_ + -0xc] = pSop._4_4_;
        local_e8[(int)pSop._4_4_] = pSop._4_4_;
      }
      if (iVar1 == 7) {
        pcVar4 = (char *)Abc_ObjData(pNode);
        Abc_SopToTruth7(pcVar4,7,Cofs6 + 1);
        nVarsMin[0] = If_Dec7PickBestMux(Cofs6 + 1,(word *)&iVar,Cofs7[0] + 1);
      }
      else {
        pcVar4 = (char *)Abc_ObjData(pNode);
        uTruth7[1] = Abc_SopToTruth(pcVar4,iVar1);
        nVarsMin[0] = If_Dec6PickBestMux(uTruth7[1],Cofs7[1] + 1);
      }
      if (nVarsMin[0] < 0) {
        if ((iVar1 != 6) && (iVar1 != 7)) {
          __assert_fail("nVars == 6 || nVars == 7",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlif.c"
                        ,0x390,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        if (iVar1 == 7) {
          uTruth6 = If_Dec7Perform(Cofs6 + 1,1);
        }
        else {
          uTruth6 = If_Dec6Perform(uTruth7[1],1);
        }
        if (uTruth6 == 0) {
          pAVar3 = Abc_ObjFanout0(pNode);
          pcVar4 = Abc_ObjName(pAVar3);
          printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar4);
        }
        else {
          for (nVarsMin[1] = 1; -1 < nVarsMin[1]; nVarsMin[1] = nVarsMin[1] + -1) {
            if (nVarsMin[1] == 0) {
              local_158 = uTruth6;
            }
            else {
              local_158 = uTruth6 >> 0x20;
            }
            Cofs6[(long)nVarsMin[1] + 1] = local_158 & 0xffff;
            Cofs6[(long)nVarsMin[1] + 1] =
                 Cofs6[(long)nVarsMin[1] + 1] << 0x10 | Cofs6[(long)nVarsMin[1] + 1];
            Cofs6[(long)nVarsMin[1] + 1] =
                 Cofs6[(long)nVarsMin[1] + 1] << 0x20 | Cofs6[(long)nVarsMin[1] + 1];
            for (pSop._4_4_ = 0; (int)pSop._4_4_ < 4; pSop._4_4_ = pSop._4_4_ + 1) {
              pVars[(long)nVarsMin[1] + -1][(long)(int)pSop._4_4_ + 8] =
                   (uint)(uTruth6 >>
                         ((char)(nVarsMin[1] << 5) + '\x10' + (char)(pSop._4_4_ << 2) & 0x3fU)) & 7;
            }
            wVar8 = If_Dec6MinimumBase(Cofs6[(long)nVarsMin[1] + 1],
                                       pVars[(long)nVarsMin[1] + -1] + 8,4,
                                       nVarsMin + (long)nVarsMin[1] + -2);
            Cofs6[(long)nVarsMin[1] + -1] = wVar8;
            fprintf((FILE *)pFile,".names");
            for (pSop._4_4_ = 0; (int)pSop._4_4_ < nVarsMin[(long)nVarsMin[1] + -2];
                pSop._4_4_ = pSop._4_4_ + 1) {
              if (pVars[(long)nVarsMin[1] + -1][(long)(int)pSop._4_4_ + 8] == 7) {
                pAVar3 = Abc_ObjFanout0(pNode);
                pcVar4 = Abc_ObjName(pAVar3);
                fprintf((FILE *)pFile," %s_cascade",pcVar4);
              }
              else {
                pAVar3 = Abc_ObjFanin(pNode,pVars[(long)nVarsMin[1] + -1][(long)(int)pSop._4_4_ + 8]
                                     );
                pcVar4 = Abc_ObjName(pAVar3);
                fprintf((FILE *)pFile," %s",pcVar4);
              }
            }
            pAVar3 = Abc_ObjFanout0(pNode);
            pcVar4 = Abc_ObjName(pAVar3);
            pcVar7 = "_cascade";
            if (nVarsMin[1] != 0) {
              pcVar7 = "";
            }
            fprintf((FILE *)pFile," %s%s\n",pcVar4,pcVar7);
            pAVar6 = Abc_ObjNtk(pNode);
            pcVar4 = Io_NtkDeriveSop((Mem_Flex_t *)pAVar6->pManFunc,Cofs6[(long)nVarsMin[1] + -1],
                                     nVarsMin[(long)nVarsMin[1] + -2],vCover);
            fprintf((FILE *)pFile,"%s",pcVar4);
          }
        }
      }
      else {
        if (iVar1 == 7) {
          If_Dec7MinimumBase((word *)&iVar,(int *)local_e8,7,pVars[1] + 8);
          If_Dec7MinimumBase(Cofs7[0] + 1,pVars[0] + 8,7,pVars[1] + 9);
        }
        else {
          Cofs7[1][1] = If_Dec6MinimumBase(Cofs7[1][1],(int *)local_e8,iVar1,pVars[1] + 8);
          Cofs6[0] = If_Dec6MinimumBase(Cofs6[0],pVars[0] + 8,iVar1,pVars[1] + 9);
        }
        if (4 < pVars[1][8]) {
          __assert_fail("nVarsMin[0] < 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlif.c"
                        ,0x37a,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        if (4 < pVars[1][9]) {
          __assert_fail("nVarsMin[1] < 5",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBlif.c"
                        ,0x37b,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
        }
        fprintf((FILE *)pFile,".names");
        pAVar3 = Abc_ObjFanin(pNode,nVarsMin[0]);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s",pcVar4);
        pAVar3 = Abc_ObjFanout0(pNode);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s_cascade0",pcVar4);
        pAVar3 = Abc_ObjFanout0(pNode);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s_cascade1",pcVar4);
        pAVar3 = Abc_ObjFanout0(pNode);
        pcVar4 = Abc_ObjName(pAVar3);
        fprintf((FILE *)pFile," %s\n",pcVar4);
        fprintf((FILE *)pFile,"1-1 1\n01- 1\n");
        for (nVarsMin[1] = 0; nVarsMin[1] < 2; nVarsMin[1] = nVarsMin[1] + 1) {
          pAVar6 = Abc_ObjNtk(pNode);
          if (iVar1 == 7) {
            local_140 = *(word *)(&iVar + (long)nVarsMin[1] * 4);
          }
          else {
            local_140 = Cofs6[(long)nVarsMin[1] + -1];
          }
          pcVar4 = Io_NtkDeriveSop((Mem_Flex_t *)pAVar6->pManFunc,local_140,
                                   nVarsMin[(long)nVarsMin[1] + -2],vCover);
          fprintf((FILE *)pFile,".names");
          for (pSop._4_4_ = 0; (int)pSop._4_4_ < nVarsMin[(long)nVarsMin[1] + -2];
              pSop._4_4_ = pSop._4_4_ + 1) {
            pAVar3 = Abc_ObjFanin(pNode,pVars[(long)nVarsMin[1] + -1][(long)(int)pSop._4_4_ + 8]);
            pcVar7 = Abc_ObjName(pAVar3);
            fprintf((FILE *)pFile," %s",pcVar7);
          }
          pAVar3 = Abc_ObjFanout0(pNode);
          pcVar7 = Abc_ObjName(pAVar3);
          fprintf((FILE *)pFile," %s_cascade%d\n",pcVar7,(ulong)(uint)nVarsMin[1]);
          fprintf((FILE *)pFile,"%s",pcVar4);
        }
      }
    }
  }
  else {
    pAVar3 = Abc_ObjFanout0(pNode);
    pcVar4 = Abc_ObjName(pAVar3);
    printf("Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n",pcVar4);
  }
  return;
}

Assistant:

void Io_NtkWriteNodeInt( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNet;
    int i, nVars = Abc_ObjFaninNum(pNode);
    if ( nVars > 7 )
    {
        printf( "Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return;
    }

    fprintf( pFile, "\n" );
    if ( nVars <= 4 )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
    }
    else
    {
        extern int  If_Dec6PickBestMux( word t, word Cofs[2] );
        extern int  If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] );
        extern word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars );
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        extern word If_Dec6Perform( word t, int fDerive );
        extern word If_Dec7Perform( word t[2], int fDerive );

        char * pSop;
        word z, uTruth6 = 0, uTruth7[2], Cofs6[2], Cofs7[2][2];
        int c, iVar, nVarsMin[2], pVars[2][10];

        // collect variables
        Abc_ObjForEachFanin( pNode, pNet, i )
            pVars[0][i] = pVars[1][i] = i;

        // derive truth table
        if ( nVars == 7 )
        {
            Abc_SopToTruth7( (char*)Abc_ObjData(pNode), nVars, uTruth7 );
            iVar = If_Dec7PickBestMux( uTruth7, Cofs7[0], Cofs7[1] );
        }
        else
        {
            uTruth6 = Abc_SopToTruth( (char*)Abc_ObjData(pNode), nVars );
            iVar = If_Dec6PickBestMux( uTruth6, Cofs6 );
        }

        // perform MUX decomposition
        if ( iVar >= 0 )
        {
            if ( nVars == 7 )
            {
                If_Dec7MinimumBase( Cofs7[0], pVars[0], nVars, &nVarsMin[0] );
                If_Dec7MinimumBase( Cofs7[1], pVars[1], nVars, &nVarsMin[1] );
            }
            else
            {
                Cofs6[0] = If_Dec6MinimumBase( Cofs6[0], pVars[0], nVars, &nVarsMin[0] );
                Cofs6[1] = If_Dec6MinimumBase( Cofs6[1], pVars[1], nVars, &nVarsMin[1] );
            }
            assert( nVarsMin[0] < 5 );
            assert( nVarsMin[1] < 5 );
            // write MUX
            fprintf( pFile, ".names" );
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,iVar)) );
            fprintf( pFile, " %s_cascade0", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s_cascade1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, "1-1 1\n01- 1\n" );
            // write cofactors
            for ( c = 0; c < 2; c++ )
            {
                pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                    (word)(nVars == 7 ? Cofs7[c][0] : Cofs6[c]), nVarsMin[c], vCover );
                fprintf( pFile, ".names" );
                for ( i = 0; i < nVarsMin[c]; i++ )
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
                fprintf( pFile, " %s_cascade%d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c );
                fprintf( pFile, "%s", pSop );
            }
            return;
        }
        assert( nVars == 6 || nVars == 7 );

        // try cascade decomposition
        if ( nVars == 7 )
        {
            z = If_Dec7Perform( uTruth7, 1 );
            //If_Dec7Verify( uTruth7, z );
        }
        else
        {
            z = If_Dec6Perform( uTruth6, 1 );
            //If_Dec6Verify( uTruth6, z );
        }
        if ( z == 0 )
        {
            printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            return;
        }

        // derive nodes
        for ( c = 1; c >= 0; c-- )
        {
            // collect fanins
            uTruth7[c]  = ((c ? z >> 32 : z) & 0xffff);
            uTruth7[c] |= (uTruth7[c] << 16);
            uTruth7[c] |= (uTruth7[c] << 32);
            for ( i = 0; i < 4; i++ )
                pVars[c][i] = (z >> (c*32+16+4*i)) & 7;

            // minimize truth table
            Cofs6[c] = If_Dec6MinimumBase( uTruth7[c], pVars[c], 4, &nVarsMin[c] );

            // write the nodes
            fprintf( pFile, ".names" );
            for ( i = 0; i < nVarsMin[c]; i++ )
                if ( pVars[c][i] == 7 )
                    fprintf( pFile, " %s_cascade", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
            fprintf( pFile, " %s%s\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c? "" : "_cascade" );

            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                (word)Cofs6[c], nVarsMin[c], vCover );
            fprintf( pFile, "%s", pSop );
        }
    }
}